

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator*(unsigned_long lhs,
         SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  longlong *in_RSI;
  int64_t *unaff_retaddr;
  longlong ret;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffff8
  ;
  
  SafeInt::operator_cast_to_long_long
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)0x0);
  MultiplicationHelper<long_long,_unsigned_long,_15>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (unaff_retaddr,(uint64_t *)in_stack_fffffffffffffff8.m_int,in_RSI);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffff8,(longlong *)&stack0xffffffffffffffe0);
  return (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         in_stack_fffffffffffffff8.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY SafeInt< T, E > operator *( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    T ret( 0 );
    MultiplicationHelper< T, U, MultiplicationMethod< T, U >::method >::template MultiplyThrow< E >( (T)rhs, lhs, ret );
    return SafeInt< T, E >(ret);
}